

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL>::reserve
          (ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *this,
          size_t minSize)

{
  PathSection *pPVar1;
  unsigned_long uVar2;
  PathSection *pPVar3;
  ulong local_28;
  size_t i;
  PathSection *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar2 = getAlignedSize<16,unsigned_long>(minSize);
    if (4 < uVar2) {
      pPVar3 = (PathSection *)operator_new__(uVar2 << 4);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        pPVar1 = this->items;
        pPVar3[local_28].name.object = pPVar1[local_28].name.object;
        pPVar3[local_28].index.object = pPVar1[local_28].index.object;
        AST::ChildEndpointPath::PathSection::~PathSection(this->items + local_28);
      }
      freeIfHeapAllocated(this);
      this->items = pPVar3;
    }
    this->numAllocated = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }